

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

iterator __thiscall ev3dev::sensor::type_name_abi_cxx11_(sensor *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  pointer ppVar4;
  iterator in_RDI;
  const_iterator s_1;
  string type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffca0;
  allocator_type *in_stack_fffffffffffffce0;
  undefined8 **ppuVar5;
  sensor *in_stack_fffffffffffffce8;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__comp;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffcf0;
  allocator *paVar6;
  iterator ppVar7;
  _Self local_2f8;
  _Self local_2f0;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e2 [2];
  undefined8 *local_2e0;
  undefined1 *local_2d8 [8];
  undefined1 local_298 [64];
  undefined1 local_258 [64];
  undefined1 local_218 [64];
  undefined1 local_1d8 [64];
  undefined1 local_198 [64];
  undefined1 local_158 [64];
  undefined1 local_118 [64];
  undefined1 local_d8 [64];
  undefined1 local_98 [64];
  undefined8 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  allocator local_31;
  string local_30 [48];
  
  ppVar7 = in_RDI;
  driver_name_abi_cxx11_(in_stack_fffffffffffffce8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    if (type_name[abi:cxx11]()::lookup_table_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&type_name[abi:cxx11]()::lookup_table_abi_cxx11_);
      if (iVar2 != 0) {
        local_2e0 = local_2d8;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [15])in_stack_fffffffffffffce8,
                   (char (*) [10])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_298;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [15])in_stack_fffffffffffffce8,
                   (char (*) [10])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_258;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[12],_const_char_(&)[15],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [12])in_stack_fffffffffffffce8,
                   (char (*) [15])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_218;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[14],_const_char_(&)[9],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [14])in_stack_fffffffffffffce8,
                   (char (*) [9])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_1d8;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[12],_const_char_(&)[13],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [12])in_stack_fffffffffffffce8,
                   (char (*) [13])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_198;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [15])in_stack_fffffffffffffce8,
                   (char (*) [10])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_158;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [15])in_stack_fffffffffffffce8,
                   (char (*) [10])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_118;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [15])in_stack_fffffffffffffce8,
                   (char (*) [10])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_d8;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[12],_const_char_(&)[15],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [12])in_stack_fffffffffffffce8,
                   (char (*) [15])in_stack_fffffffffffffce0);
        local_2e0 = (undefined8 *)local_98;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[11],_true>
                  (in_stack_fffffffffffffcf0,(char (*) [15])in_stack_fffffffffffffce8,
                   (char (*) [11])in_stack_fffffffffffffce0);
        local_58 = local_2d8;
        local_50 = 10;
        __comp = local_2e2;
        std::
        allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x1f9738);
        __l._M_len = (size_type)ppVar7;
        __l._M_array = in_RDI;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffcf0,__l,__comp,in_stack_fffffffffffffce0);
        std::
        allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1f9770);
        ppuVar5 = &local_58;
        do {
          ppuVar5 = ppuVar5 + -8;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(in_stack_fffffffffffffca0);
        } while (ppuVar5 != (undefined8 **)local_2d8);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::~map,&type_name[abi:cxx11]()::lookup_table_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&type_name[abi:cxx11]()::lookup_table_abi_cxx11_);
      }
    }
    local_2f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(in_stack_fffffffffffffc98,(key_type *)0x1f97e9);
    local_2f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffc98);
    bVar1 = std::operator!=(&local_2f0,&local_2f8);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x1f982d);
      std::__cxx11::string::string((string *)in_RDI,(string *)&ppVar4->second);
    }
    else {
      std::__cxx11::string::string((string *)in_RDI,local_30);
    }
  }
  else {
    if (type_name[abi:cxx11]()::s_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&type_name[abi:cxx11]()::s_abi_cxx11_);
      if (iVar2 != 0) {
        paVar6 = &local_31;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)type_name[abi:cxx11]()::s_abi_cxx11_,"<none>",paVar6)
        ;
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
        __cxa_atexit(std::__cxx11::string::~string,type_name[abi:cxx11]()::s_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&type_name[abi:cxx11]()::s_abi_cxx11_);
      }
    }
    std::__cxx11::string::string((string *)in_RDI,(string *)type_name[abi:cxx11]()::s_abi_cxx11_);
  }
  local_48 = 1;
  std::__cxx11::string::~string(local_30);
  return ppVar7;
}

Assistant:

std::string sensor::type_name() const {
    auto type = driver_name();
    if (type.empty()) {
        static const std::string s("<none>");
        return s;
    }

    static const std::map<sensor_type, const std::string> lookup_table {
        { ev3_touch,       "EV3 touch" },
        { ev3_color,       "EV3 color" },
        { ev3_ultrasonic,  "EV3 ultrasonic" },
        { ev3_gyro,        "EV3 gyro" },
        { ev3_infrared,    "EV3 infrared" },
        { nxt_touch,       "NXT touch" },
        { nxt_light,       "NXT light" },
        { nxt_sound,       "NXT sound" },
        { nxt_ultrasonic,  "NXT ultrasonic" },
        { nxt_i2c_sensor,  "I2C sensor" }
        };

    auto s = lookup_table.find(type);
    if (s != lookup_table.end())
        return s->second;

    return type;
}